

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetIRCHKSourceXY(ndicapi *pol,int side,int i,double *xy)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int m;
  int n;
  char *dp;
  double *xy_local;
  int i_local;
  int side_local;
  ndicapi *pol_local;
  
  _m = pol->IrchkSources;
  if ((_m == (char *)0x0) || (*_m == '\0')) {
    pol_local._4_4_ = 2;
  }
  else {
    lVar3 = ndiSignedToLong(_m,3);
    iVar1 = (int)lVar3;
    if ((iVar1 < 0) || (0x14 < iVar1)) {
      pol_local._4_4_ = 2;
    }
    else {
      lVar3 = ndiSignedToLong(pol->IrchkSources + (long)(iVar1 * 6) + 3,3);
      iVar2 = (int)lVar3;
      if ((iVar2 < 0) || (0x14 < iVar2)) {
        pol_local._4_4_ = 2;
      }
      else {
        if (side == 0) {
          if ((i < 0) || (iVar1 <= i)) {
            return 2;
          }
          _m = _m + (i * 6 + 3);
        }
        else if (side == 1) {
          if ((i < 0) || (iVar2 <= i)) {
            return 2;
          }
          _m = _m + (iVar1 * 6 + 6 + i * 6);
        }
        else if (side == 1) {
          return 2;
        }
        lVar3 = ndiSignedToLong(_m,3);
        *xy = (double)lVar3 * 0.01;
        lVar3 = ndiSignedToLong(_m + 3,3);
        xy[1] = (double)lVar3 * 0.01;
        pol_local._4_4_ = 0;
      }
    }
  }
  return pol_local._4_4_;
}

Assistant:

ndicapiExport int ndiGetIRCHKSourceXY(ndicapi* pol, int side, int i, double xy[2])
{
  const char* dp;
  int n, m;

  dp = pol->IrchkSources;

  if (dp == NULL || *dp == '\0')
  {
    return NDI_MISSING;
  }

  n = (int)ndiSignedToLong(dp, 3);
  if (n < 0 || n > 20)
  {
    return NDI_MISSING;
  }
  m = (int)ndiSignedToLong(dp + 3 + 2 * 3 * n, 3);
  if (m < 0 || m > 20)
  {
    return NDI_MISSING;
  }

  if (side == NDI_LEFT)
  {
    if (i < 0 || i >= n)
    {
      return NDI_MISSING;
    }
    dp += 3 + 2 * 3 * i;
  }
  else if (side == NDI_RIGHT)
  {
    if (i < 0 || i >= m)
    {
      return NDI_MISSING;
    }
    dp += 3 + 2 * 3 * n + 3 + 2 * 3 * i;
  }
  else if (side == NDI_RIGHT)
  {
    return NDI_MISSING;
  }

  xy[0] = ndiSignedToLong(&dp[0], 3) * 0.01;
  xy[1] = ndiSignedToLong(&dp[3], 3) * 0.01;

  return NDI_OKAY;
}